

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstract.h
# Opt level: O2

istream * covenant::operator>>(istream *in,AbstractMethod *abs)

{
  bool bVar1;
  string *this;
  AbstractMethod AVar2;
  allocator local_59;
  string token;
  string local_38 [32];
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::operator>>(in,(string *)&token);
  bVar1 = std::operator==(&token,"sigma-star");
  AVar2 = SIGMA_STAR;
  if (!bVar1) {
    bVar1 = std::operator==(&token,"cycle-breaking");
    if (!bVar1) {
      this = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_38,"invalid abstraction method",&local_59);
      std::__cxx11::string::string(this,local_38);
      __cxa_throw(this,&error::typeinfo,error::~error);
    }
    AVar2 = CYCLE_BREAKING;
  }
  *abs = AVar2;
  std::__cxx11::string::~string((string *)&token);
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, AbstractMethod& abs)
{
    std::string token;
    in >> token;
    if (token == "sigma-star")
        abs = SIGMA_STAR;
    else if (token == "cycle-breaking")
        abs = CYCLE_BREAKING;
    else throw error("invalid abstraction method");
    return in;
}